

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Compaction * __thiscall leveldb::VersionSet::PickCompaction(VersionSet *this)

{
  int *piVar1;
  Version *pVVar2;
  pointer ppFVar3;
  size_type sVar4;
  int iVar5;
  Compaction *this_00;
  int level;
  size_t i;
  ulong uVar6;
  FileMetaData *f;
  InternalKey largest;
  InternalKey smallest;
  FileMetaData *local_78;
  InternalKey local_70;
  InternalKey local_50;
  
  pVVar2 = this->current_;
  if (1.0 <= pVVar2->compaction_score_) {
    level = pVVar2->compaction_level_;
    this_00 = (Compaction *)operator_new(0x158);
    Compaction::Compaction(this_00,this->options_,level);
    for (uVar6 = 0;
        ppFVar3 = this->current_->files_[level].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)this->current_->files_[level].
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3);
        uVar6 = uVar6 + 1) {
      local_78 = ppFVar3[uVar6];
      sVar4 = this->compact_pointer_[level]._M_string_length;
      if (sVar4 == 0) {
LAB_001158d6:
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                  (this_00->inputs_,&local_78);
        break;
      }
      local_50.rep_._M_dataplus._M_p = (local_78->largest).rep_._M_dataplus._M_p;
      local_50.rep_._M_string_length = (local_78->largest).rep_._M_string_length;
      local_70.rep_._M_dataplus._M_p = this->compact_pointer_[level]._M_dataplus._M_p;
      local_70.rep_._M_string_length = sVar4;
      iVar5 = InternalKeyComparator::Compare(&this->icmp_,(Slice *)&local_50,(Slice *)&local_70);
      if (0 < iVar5) goto LAB_001158d6;
    }
    if (this_00->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        this_00->inputs_[0].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                (this_00->inputs_,
                 this->current_->files_[level].
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    if (pVVar2->file_to_compact_ == (FileMetaData *)0x0) {
      return (Compaction *)0x0;
    }
    level = pVVar2->file_to_compact_level_;
    this_00 = (Compaction *)operator_new(0x158);
    Compaction::Compaction(this_00,this->options_,level);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
              (this_00->inputs_,&this->current_->file_to_compact_);
  }
  pVVar2 = this->current_;
  this_00->input_version_ = pVVar2;
  piVar1 = &pVVar2->refs_;
  *piVar1 = *piVar1 + 1;
  if (level == 0) {
    local_50.rep_._M_dataplus._M_p = (pointer)&local_50.rep_.field_2;
    local_50.rep_._M_string_length = 0;
    local_70.rep_._M_dataplus._M_p = (pointer)&local_70.rep_.field_2;
    local_70.rep_._M_string_length = 0;
    local_50.rep_.field_2._M_local_buf[0] = '\0';
    local_70.rep_.field_2._M_local_buf[0] = '\0';
    GetRange(this,this_00->inputs_,&local_50,&local_70);
    Version::GetOverlappingInputs(this->current_,0,&local_50,&local_70,this_00->inputs_);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  SetupOtherInputs(this,this_00);
  return this_00;
}

Assistant:

Compaction* VersionSet::PickCompaction() {
  Compaction* c;
  int level;

  // We prefer compactions triggered by too much data in a level over
  // the compactions triggered by seeks.
  const bool size_compaction = (current_->compaction_score_ >= 1);
  const bool seek_compaction = (current_->file_to_compact_ != nullptr);
  if (size_compaction) {
    level = current_->compaction_level_;
    assert(level >= 0);
    assert(level + 1 < config::kNumLevels);
    c = new Compaction(options_, level);

    // Pick the first file that comes after compact_pointer_[level]
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      FileMetaData* f = current_->files_[level][i];
      if (compact_pointer_[level].empty() ||
          icmp_.Compare(f->largest.Encode(), compact_pointer_[level]) > 0) {
        c->inputs_[0].push_back(f);
        break;
      }
    }
    if (c->inputs_[0].empty()) {
      // Wrap-around to the beginning of the key space
      c->inputs_[0].push_back(current_->files_[level][0]);
    }
  } else if (seek_compaction) {
    level = current_->file_to_compact_level_;
    c = new Compaction(options_, level);
    c->inputs_[0].push_back(current_->file_to_compact_);
  } else {
    return nullptr;
  }

  c->input_version_ = current_;
  c->input_version_->Ref();

  // Files in level 0 may overlap each other, so pick up all overlapping ones
  if (level == 0) {
    InternalKey smallest, largest;
    GetRange(c->inputs_[0], &smallest, &largest);
    // Note that the next call will discard the file we placed in
    // c->inputs_[0] earlier and replace it with an overlapping set
    // which will include the picked file.
    current_->GetOverlappingInputs(0, &smallest, &largest, &c->inputs_[0]);
    assert(!c->inputs_[0].empty());
  }

  SetupOtherInputs(c);

  return c;
}